

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game_text.cpp
# Opt level: O2

void __thiscall
GameText::GameText(GameText *this,string *text,string *name,uint8_t lines_in_textbox)

{
  byte bVar1;
  uint16_t uVar2;
  size_type sVar3;
  string full_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (this->_initial_text)._M_dataplus._M_p = (pointer)&(this->_initial_text).field_2;
  (this->_initial_text)._M_string_length = 0;
  (this->_initial_text).field_2._M_local_buf[0] = '\0';
  (this->_output_text)._M_dataplus._M_p = (pointer)&(this->_output_text).field_2;
  (this->_output_text)._M_string_length = 0;
  (this->_output_text).field_2._M_local_buf[0] = '\0';
  this->_current_line_length = 0;
  this->_current_line_count = '\0';
  this->_lines_in_textbox = lines_in_textbox;
  std::operator+(&local_70,name,": ");
  uVar2 = this->_current_line_length;
  for (sVar3 = 0; local_70._M_string_length != sVar3; sVar3 = sVar3 + 1) {
    bVar1 = character_width(local_70._M_dataplus._M_p[sVar3]);
    uVar2 = uVar2 + bVar1;
    this->_current_line_length = uVar2;
  }
  if (name->_M_string_length == 0) {
    GameText::text(this,text);
  }
  else {
    std::operator+(&local_50,"\x1c",text);
    GameText::text(this,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  std::__cxx11::string::~string((string *)&local_70);
  return;
}

Assistant:

GameText::GameText(const std::string& text, const std::string& name, uint8_t lines_in_textbox) :
    _lines_in_textbox(lines_in_textbox)
{
    std::string full_name = name + ": ";
    for(char c : full_name)
        _current_line_length += character_width(c);

    if(!name.empty())
        this->text("\u001c" + text);
    else
        this->text(text);
}